

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O1

int * __thiscall
sisl::cartesian_cubic<int>::operator()(cartesian_cubic<int> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  
  uVar1 = vl->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (uint *)((ulong)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar4 + 2;
  }
  uVar1 = *puVar4;
  uVar2 = vl->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    puVar4 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    puVar4 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar4 + 2;
  }
  uVar2 = *puVar4;
  this->__zero = 0;
  if ((((-1 < d0) && ((uint)d0 <= this->_nx)) && (-1 < (int)uVar1)) &&
     (((uVar1 <= this->_ny && (-1 < (int)uVar2)) && (uVar2 <= this->_nz)))) {
    piVar3 = array_n<int,_3,_std::allocator<int>_>::operator()(&this->_array,d0);
    return piVar3;
  }
  return &this->__zero;
}

Assistant:

virtual T& operator()(int d0, va_list vl) {
            unsigned int _x = d0, _y = 0, _z = 0;
            _y = va_arg(vl, unsigned int);
            _z = va_arg(vl, unsigned int);

            __zero = 0;

            if(!in_bound(_x, _y, _z)) return __zero;
            return _array(_x, _y, _z);
        }